

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,basic_string_view<char> value)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong size;
  char *data;
  str_writer<char> f;
  error_handler local_19;
  
  uVar3 = value.size_;
  cVar1 = this->specs_->type_;
  if ((cVar1 != '\0') && (cVar1 != 's')) {
    error_handler::on_error(&local_19,"invalid type specifier");
  }
  uVar2 = (ulong)this->specs_->precision_;
  size = uVar3;
  if (uVar2 < uVar3) {
    size = uVar2;
  }
  if ((long)uVar2 < 0) {
    size = uVar3;
  }
  f.size = size;
  f.s = value.data_;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,size,&this->specs_->super_align_spec,f);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    internal::check_string_type_spec(specs_.type_, internal::error_handler());
    writer_.write_str(value, specs_);
    return out();
  }